

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  ImGuiWindow *pIVar1;
  float in_ESI;
  int *in_RDI;
  float in_XMM0_Da;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *in_stack_00000090;
  
  pIVar1 = GImGui->CurrentWindow;
  if ((GImGui->CurrentTable != (ImGuiTable *)0x0) && ((GImGui->CurrentTable->IsInsideRow & 1U) != 0)
     ) {
    ImGui::TableEndRow(in_stack_00000090);
  }
  in_RDI[5] = (int)(pIVar1->DC).CursorPos.y;
  in_RDI[4] = (int)in_XMM0_Da;
  in_RDI[2] = (int)in_ESI;
  in_RDI[3] = 0;
  *in_RDI = -1;
  in_RDI[1] = -1;
  if (0.0 < (float)in_RDI[4]) {
    ImGui::CalcListClipping(g._4_4_,g._0_4_,(int *)window,(int *)table);
    if (0 < *in_RDI) {
      SetCursorPosYAndSetupDummyPrevLine(in_ESI,in_XMM0_Da);
    }
    in_RDI[3] = 2;
  }
  return;
}

Assistant:

void ImGuiListClipper::Begin(int count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = count;
    StepNo = 0;
    DisplayEnd = DisplayStart = -1;
    if (ItemsHeight > 0.0f)
    {
        ImGui::CalcListClipping(ItemsCount, ItemsHeight, &DisplayStart, &DisplayEnd); // calculate how many to clip/display
        if (DisplayStart > 0)
            SetCursorPosYAndSetupDummyPrevLine(StartPosY + DisplayStart * ItemsHeight, ItemsHeight); // advance cursor
        StepNo = 2;
    }
}